

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

HaltonSampler * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::HaltonSampler,int&,pbrt::Point2<int>const&,pbrt::RandomizeStrategy&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,int *args,Point2<int> *args_1,
          RandomizeStrategy *args_2,int *args_3,polymorphic_allocator<std::byte> *args_4)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x38,8);
  construct<pbrt::HaltonSampler,int&,pbrt::Point2<int>const&,pbrt::RandomizeStrategy&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (this,(HaltonSampler *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4);
  return (HaltonSampler *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }